

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O3

int dwarf_get_ranges_b(Dwarf_Debug dbg,Dwarf_Off rangesoffset,Dwarf_Die die,Dwarf_Off *actual_offset
                      ,Dwarf_Ranges **rangesbuf,Dwarf_Signed *listlen,Dwarf_Unsigned *bytecount,
                      Dwarf_Error *error)

{
  Dwarf_Small *rangeptr;
  Dwarf_CU_Context_conflict pDVar1;
  uint uVar2;
  Dwarf_Addr DVar3;
  Dwarf_Off *pDVar4;
  undefined8 *puVar5;
  int iVar6;
  Dwarf_Debug pDVar7;
  ulong uVar8;
  undefined8 *puVar9;
  Dwarf_Ranges *pDVar10;
  uint uVar11;
  char *pcVar12;
  Dwarf_Signed DVar13;
  Dwarf_Unsigned v;
  undefined8 *__ptr;
  ulong uVar14;
  Dwarf_Small *pDVar15;
  Dwarf_Off DVar16;
  bool bVar17;
  Dwarf_Error localerror;
  dwarfstring m;
  Dwarf_Half local_dc;
  Dwarf_Half local_da;
  Dwarf_Debug local_d8;
  Dwarf_Off local_d0;
  Dwarf_Small *local_c8;
  Dwarf_Small *local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  Dwarf_Error local_a0;
  Dwarf_Small *local_98;
  Dwarf_Off *local_90;
  long local_88;
  ulong local_80;
  undefined8 *local_78;
  ulong local_70;
  ulong local_68;
  Dwarf_Ranges **local_60;
  ulong *local_58;
  dwarfstring_s local_50;
  
  local_a0 = (Dwarf_Error)0x0;
  local_da = 3;
  local_dc = 4;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    pcVar12 = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_ranges_b()either null or it containsa stale Dwarf_Debug pointer"
    ;
    DVar13 = 0x51;
    dbg = (Dwarf_Debug)0x0;
LAB_0017df3d:
    _dwarf_error_string(dbg,error,DVar13,pcVar12);
    return 1;
  }
  local_60 = rangesbuf;
  local_58 = (ulong *)listlen;
  if (die == (Dwarf_Die)0x0) {
    pDVar15 = &dbg->de_pointer_size;
    v = 0;
    local_d0 = rangesoffset;
  }
  else {
    iVar6 = dwarf_get_version_of_die(die,&local_da,&local_dc);
    if ((iVar6 == 1) || (pDVar1 = die->di_cu_context, pDVar1 == (Dwarf_CU_Context_conflict)0x0)) {
      DVar13 = 0x68;
      goto LAB_0017df6b;
    }
    if (pDVar1->cc_unit_type == 4) {
      v = 0;
    }
    else {
      v = pDVar1->cc_ranges_base;
    }
    local_d0 = rangesoffset + v;
    pDVar15 = &pDVar1->cc_address_size;
  }
  local_a8 = (ulong)*pDVar15;
  iVar6 = _dwarf_load_section(dbg,&dbg->de_debug_ranges,error);
  if (iVar6 == 1) {
    return 1;
  }
  pDVar7 = dbg;
  if (iVar6 == -1) {
    local_d8 = (dbg->de_tied_data).td_tied_object;
    if (local_d8 == (Dwarf_Debug)0x0) {
      return -1;
    }
    iVar6 = _dwarf_load_section(local_d8,&local_d8->de_debug_ranges,&local_a0);
    if (iVar6 == -1) {
      return -1;
    }
    pDVar7 = local_d8;
    if (iVar6 == 1) {
      _dwarf_error_mv_s_to_t(local_d8,&local_a0,dbg,error);
      return 1;
    }
  }
  uVar14 = (pDVar7->de_debug_ranges).dss_size;
  if (uVar14 <= local_d0) {
    return -1;
  }
  if (v < uVar14) {
    pDVar15 = (pDVar7->de_debug_ranges).dss_data;
    local_c8 = pDVar15 + uVar14;
    pDVar15 = pDVar15 + local_d0;
    local_b0 = (ulong)(uint)((int)local_a8 * 2);
    local_b8 = local_a8 & 0xffffffff;
    local_88 = -1;
    if ((int)local_a8 != 8) {
      local_88 = 0xffffffff;
    }
    uVar8 = 1;
    puVar9 = (undefined8 *)0x0;
    __ptr = (undefined8 *)0x0;
    DVar16 = local_d0;
    local_d8 = pDVar7;
    local_98 = pDVar15;
    local_90 = actual_offset;
    local_80 = uVar14;
    do {
      if (local_c8 < pDVar15) goto joined_r0x0017e254;
      local_78 = puVar9;
      local_70 = DVar16;
      local_68 = uVar8;
      puVar9 = (undefined8 *)calloc(1,0x20);
      pDVar7 = local_d8;
      if (puVar9 == (undefined8 *)0x0) goto joined_r0x0017e2ab;
      if (local_c8 < pDVar15 + local_b0) {
        free(puVar9);
        while (__ptr != (undefined8 *)0x0) {
          puVar9 = (undefined8 *)*__ptr;
          free(__ptr);
          __ptr = puVar9;
        }
        pcVar12 = 
        "DW_DLE_DEBUG_RANGES_OFFSET_BAD:  Not at the end of the ranges section  but there is not enough room in the section  for the next ranges entry"
        ;
        DVar13 = 0xce;
        goto LAB_0017df3d;
      }
      local_50.s_data = (char *)0x0;
      rangeptr = pDVar15 + local_b8;
      if (local_c8 < rangeptr) {
        _dwarf_error_string(local_d8,error,0x14b,
                            "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section")
        ;
        free(puVar9);
        while (__ptr != (undefined8 *)0x0) {
          puVar9 = (undefined8 *)*__ptr;
          free(__ptr);
          __ptr = puVar9;
        }
        return 1;
      }
      local_c0 = pDVar15 + local_b0;
      (*local_d8->de_copy_word)(&local_50,pDVar15,local_b8);
      puVar9[1] = local_50.s_data;
      iVar6 = read_unaligned_addr_check(pDVar7,puVar9 + 2,rangeptr,(uint)local_a8,error,local_c8);
      if (iVar6 != 0) {
        free(puVar9);
        while (__ptr != (undefined8 *)0x0) {
          puVar9 = (undefined8 *)*__ptr;
          free(__ptr);
          __ptr = puVar9;
        }
        return 1;
      }
      puVar5 = puVar9;
      if (__ptr != (undefined8 *)0x0) {
        *local_78 = puVar9;
        puVar5 = __ptr;
      }
      __ptr = puVar5;
      uVar2 = (uint)local_68;
      if ((puVar9[1] == 0) && (puVar9[2] == 0)) {
        *(undefined4 *)(puVar9 + 3) = 2;
        goto LAB_0017e37d;
      }
      pDVar15 = rangeptr + local_b8;
      *(uint *)(puVar9 + 3) = (uint)(puVar9[1] == local_88);
      uVar8 = (ulong)(uVar2 + 1);
      DVar16 = local_70 + local_b0;
    } while (local_80 != DVar16);
    local_c0 = local_c8;
LAB_0017e37d:
    uVar14 = local_68 & 0xffffffff;
    pDVar10 = (Dwarf_Ranges *)_dwarf_get_alloc(dbg,'\x1d',uVar14);
    pDVar4 = local_90;
    if (pDVar10 != (Dwarf_Ranges *)0x0) {
      *local_60 = pDVar10;
      *local_58 = uVar14;
      if (uVar2 != 0) {
        puVar9 = __ptr;
        uVar11 = 1;
        do {
          *(undefined8 *)&pDVar10->dwr_type = puVar9[3];
          DVar3 = puVar9[2];
          pDVar10->dwr_addr1 = puVar9[1];
          pDVar10->dwr_addr2 = DVar3;
          puVar9 = (undefined8 *)*puVar9;
          if (puVar9 == (undefined8 *)0x0) break;
          pDVar10 = pDVar10 + 1;
          bVar17 = uVar11 < uVar2;
          uVar11 = uVar11 + 1;
        } while (bVar17);
      }
      do {
        puVar9 = (undefined8 *)*__ptr;
        free(__ptr);
        __ptr = puVar9;
      } while (puVar9 != (undefined8 *)0x0);
      if (pDVar4 != (Dwarf_Off *)0x0) {
        *pDVar4 = local_d0;
      }
      if (bytecount != (Dwarf_Unsigned *)0x0) {
        *bytecount = (long)local_c0 - (long)local_98;
        return 0;
      }
      return 0;
    }
    do {
      puVar9 = (undefined8 *)*__ptr;
      free(__ptr);
      __ptr = puVar9;
    } while (puVar9 != (undefined8 *)0x0);
    DVar13 = 0xd0;
    goto LAB_0017df6b;
  }
  dwarfstring_constructor(&local_50);
  dwarfstring_append_printf_u(&local_50,"DW_DLE_DEBUG_RANGES_OFFSET_BAD:  ranges base is 0x%lx ",v);
  dwarfstring_append_printf_u
            (&local_50," and section size is 0x%lx.",(pDVar7->de_debug_ranges).dss_size);
  pcVar12 = dwarfstring_string(&local_50);
  _dwarf_error_string(dbg,error,0xce,pcVar12);
LAB_0017e23f:
  dwarfstring_destructor(&local_50);
  return 1;
joined_r0x0017e254:
  while (__ptr != (undefined8 *)0x0) {
    puVar9 = (undefined8 *)*__ptr;
    free(__ptr);
    __ptr = puVar9;
  }
  dwarfstring_constructor(&local_50);
  dwarfstring_append(&local_50,
                     "DW_DLE_DEBUG_RANGES_OFFSET_BAD:  ranges pointer ran off the end of the  section"
                    );
  pcVar12 = dwarfstring_string(&local_50);
  _dwarf_error_string(dbg,error,0xce,pcVar12);
  goto LAB_0017e23f;
joined_r0x0017e2ab:
  while (__ptr != (undefined8 *)0x0) {
    puVar9 = (undefined8 *)*__ptr;
    free(__ptr);
    __ptr = puVar9;
  }
  DVar13 = 0xd0;
LAB_0017df6b:
  _dwarf_error(dbg,error,DVar13);
  return 1;
}

Assistant:

int dwarf_get_ranges_b(Dwarf_Debug dbg,
    Dwarf_Off rangesoffset,
    Dwarf_Die die,
    Dwarf_Off *actual_offset /* in .debug_ranges */,
    Dwarf_Ranges ** rangesbuf,
    Dwarf_Signed * listlen,
    Dwarf_Unsigned * bytecount,
    Dwarf_Error * error)
{
    Dwarf_Small *rangeptr = 0;
    Dwarf_Small *beginrangeptr = 0;
    Dwarf_Small *section_end = 0;
    unsigned entry_count = 0;
    struct ranges_entry *base = 0;
    struct ranges_entry *last = 0;
    struct ranges_entry *curre = 0;
    Dwarf_Ranges * ranges_data_out = 0;
    unsigned copyindex = 0;
    Dwarf_Half address_size = 0;
    int res = DW_DLV_ERROR;
    Dwarf_Unsigned ranges_base = 0;
    Dwarf_Debug    localdbg = dbg;
    Dwarf_Error    localerror = 0;

    /* default for dwarf_get_ranges() */
    Dwarf_Half     die_version = 3;

    Dwarf_Half offset_size= 4;
    Dwarf_CU_Context cucontext = 0;

    CHECK_DBG(dbg,error,"dwarf_get_ranges_b()");
    address_size = localdbg->de_pointer_size; /* default  */
    if (die) {
        /*  printing by raw offset from DW_AT_ranges attribute.
            If we wind up using the tied file the die_version
            had better match! It cannot be other than a match.
            Can return DW_DLV_ERROR, not DW_DLV_NO_ENTRY.
            Add err code if error.  Version comes from the
            cu context, not the DIE itself. */
        res = dwarf_get_version_of_die(die,&die_version,
            &offset_size);
        if (res == DW_DLV_ERROR) {
            _dwarf_error(dbg, error, DW_DLE_DIE_NO_CU_CONTEXT);
            return DW_DLV_ERROR;
        }
        if (!die->di_cu_context) {
            _dwarf_error(dbg, error, DW_DLE_DIE_NO_CU_CONTEXT);
            return DW_DLV_ERROR;
        }
        cucontext = die->di_cu_context;
        /*  The DW4 ranges base was never used in GNU
            but did get emitted, the note says, but
            the note is probably obsolete (so, now wrong).
            http://llvm.1065342.n5.nabble.com/DebugInfo\
            -DW-AT-GNU-ranges-base-in-non-fission-\
            td64194.html
            HOWEVER: in dw4 GNU fission extension
            it is used and matters.
            */
        /*  ranges_base was merged from tied context.
            Otherwise it is zero. But not if
            the current die is the skeleton */
        if (cucontext->cc_unit_type != DW_UT_skeleton) {
            ranges_base = cucontext->cc_ranges_base;
        }
        rangesoffset += ranges_base;
        address_size = cucontext->cc_address_size;
    } else {
        /*  Printing by raw offset
            The caller will use the bytecount to
            increment to the next part of .debug_ranges
            and will call again with the next offset */
    }

    localdbg = dbg;
    res = _dwarf_load_section(localdbg, &localdbg->de_debug_ranges,
        error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        /* data is in a.out, not dwp */
        localdbg = dbg->de_tied_data.td_tied_object;
        if (!localdbg) {
            return DW_DLV_NO_ENTRY;
        }
        res = _dwarf_load_section(localdbg,
            &localdbg->de_debug_ranges, &localerror);
        if (res == DW_DLV_ERROR) {
            _dwarf_error_mv_s_to_t(localdbg,&localerror,dbg,error);
            return res;
        }
        if (res == DW_DLV_NO_ENTRY) {
            return res;
        }
    }

    /*  Be safe in case adding rangesoffset and rangebase
        overflows. */
    if (rangesoffset  >= localdbg->de_debug_ranges.dss_size) {
        /* Documented behavior in libdwarf2.1.mm */
        return DW_DLV_NO_ENTRY;
    }
    if (ranges_base >= localdbg->de_debug_ranges.dss_size) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
            " ranges base is 0x%lx ",ranges_base);
        dwarfstring_append_printf_u(&m,
            " and section size is 0x%lx.",
            localdbg->de_debug_ranges.dss_size);
        _dwarf_error_string(dbg, error,
            DW_DLE_DEBUG_RANGES_OFFSET_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    if (rangesoffset >= localdbg->de_debug_ranges.dss_size) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
            " ranges base+offset  is 0x%lx ",
            ranges_base+rangesoffset);
        dwarfstring_append_printf_u(&m,
            " and section size is 0x%lx.",
            localdbg->de_debug_ranges.dss_size);
        _dwarf_error_string(dbg, error,
            DW_DLE_DEBUG_RANGES_OFFSET_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }

    /*  tied address_size must match the dwo address_size */
    section_end = localdbg->de_debug_ranges.dss_data +
        localdbg->de_debug_ranges.dss_size;
    rangeptr = localdbg->de_debug_ranges.dss_data;
#if 0
    if (!rangeslocal) {
        /* printing ranges where range source is dwp,
            here we just assume present. */
    }
#endif
    rangeptr += rangesoffset;
    beginrangeptr = rangeptr;

    for (;;) {
        struct ranges_entry * re = 0;

        if (rangeptr == section_end) {
            break;
        }
        if (rangeptr  > section_end) {
            dwarfstring m;

            free_allocated_ranges(base);
            dwarfstring_constructor(&m);
            dwarfstring_append(&m,
                "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
                " ranges pointer ran off the end "
                "of the  section");
            _dwarf_error_string(dbg, error,
                DW_DLE_DEBUG_RANGES_OFFSET_BAD,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        re = calloc(1, sizeof(struct ranges_entry));
        if (!re) {
            free_allocated_ranges(base);
            _dwarf_error(dbg, error, DW_DLE_DEBUG_RANGES_OUT_OF_MEM);
            return DW_DLV_ERROR;
        }
        if ((rangeptr + (2*address_size)) > section_end) {
            free(re);
            free_allocated_ranges(base);
            _dwarf_error_string(dbg, error,
                DW_DLE_DEBUG_RANGES_OFFSET_BAD,
                "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
                " Not at the end of the ranges section "
                " but there is not enough room in the section "
                " for the next ranges entry");
            return  DW_DLV_ERROR;
        }
        entry_count++;
        res = read_unaligned_addr_check(localdbg,&re->cur.dwr_addr1,
            rangeptr, address_size,error,section_end);
        if (res != DW_DLV_OK) {
            free(re);
            free_allocated_ranges(base);
            return res;
        }
        rangeptr +=  address_size;
        res = read_unaligned_addr_check(localdbg,&re->cur.dwr_addr2,
            rangeptr, address_size,error,section_end);
        if (res != DW_DLV_OK) {
            free(re);
            free_allocated_ranges(base);
            return res;
        }
        rangeptr +=  address_size;
        if (!base) {
            base = re;
            last = re;
        } else {
            last->next = re;
            last = re;
        }
        if (re->cur.dwr_addr1 == 0 && re->cur.dwr_addr2 == 0) {
            re->cur.dwr_type =  DW_RANGES_END;
            break;
        } else if (re->cur.dwr_addr1 == MAX_ADDR) {
            re->cur.dwr_type =  DW_RANGES_ADDRESS_SELECTION;
        } else {
            re->cur.dwr_type =  DW_RANGES_ENTRY;
        }
    }

    /* We return ranges on dbg, so use that to allocate. */
    ranges_data_out =   (Dwarf_Ranges *)
        _dwarf_get_alloc(dbg,DW_DLA_RANGES,entry_count);
    if (!ranges_data_out) {
        /* Error, apply to original, not local dbg. */
        free_allocated_ranges(base);
        _dwarf_error(dbg, error, DW_DLE_DEBUG_RANGES_OUT_OF_MEM);
        return DW_DLV_ERROR;
    }
    curre = base;
    *rangesbuf = ranges_data_out;
    *listlen = entry_count;
    for (copyindex = 0; curre && (copyindex < entry_count);
        ++copyindex,++ranges_data_out,curre=curre->next) {
        *ranges_data_out = curre->cur;
    }
    /* ASSERT: curre == NULL */
    free_allocated_ranges(base);
    base = 0;
    /* Callers will often not care about the bytes used. */
    if (actual_offset) {
        *actual_offset = rangesoffset;
    }
    if (bytecount) {
        *bytecount = rangeptr - beginrangeptr;
    }
    return DW_DLV_OK;
}